

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void qt_rectfill_nonpremul_rgba
               (QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color)

{
  uchar *puVar1;
  QRgba64 QVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  quint32 *pqVar8;
  
  puVar1 = rasterBuffer->m_buffer;
  QVar2 = QRgba64::unpremultiplied(color);
  uVar5 = (QVar2.rgba & 0xffff0000ffff) + 0x8000000080;
  uVar3 = (QVar2.rgba >> 0x10 & 0xffff0000ffff) + 0x8000000080;
  lVar6 = uVar5 - (uVar5 >> 8 & 0x1ff000001ff);
  lVar4 = uVar3 - (uVar3 >> 8 & 0x1ff000001ff);
  uVar7 = (((uint)lVar6 & 0xff00) << 8) >> 0x10 |
          (uint)(byte)((ulong)lVar6 >> 0x28) << 0x10 |
          (uint)lVar4 & 0xff00 | (uint)((ulong)lVar4 >> 0x10) & 0xff000000;
  uVar3 = rasterBuffer->bytes_per_line;
  pqVar8 = (quint32 *)(puVar1 + (long)y * uVar3 + (long)x * 4);
  lVar4 = (long)width;
  if ((uVar3 & 0xffffffff) == lVar4 * 4) {
    (*qt_memfill32)(pqVar8,uVar7,height * lVar4);
    return;
  }
  if (0 < height) {
    do {
      (*qt_memfill32)(pqVar8,uVar7,lVar4);
      pqVar8 = (quint32 *)((long)pqVar8 + uVar3);
      height = height + -1;
    } while (height != 0);
  }
  return;
}

Assistant:

static void qt_rectfill_nonpremul_rgba(QRasterBuffer *rasterBuffer,
                                       int x, int y, int width, int height,
                                       const QRgba64 &color)
{
    qt_rectfill<quint32>(reinterpret_cast<quint32 *>(rasterBuffer->buffer()),
                         ARGB2RGBA(color.unpremultiplied().toArgb32()), x, y, width, height, rasterBuffer->bytesPerLine());
}